

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall
t_lua_generator::t_lua_generator
          (t_lua_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  
  t_generator::t_generator((t_generator *)this,program);
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_lua_generator_00410d90;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_types_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_consts_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_service_);
  this->gen_requires_ = true;
  p_Var2 = (parsed_options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(parsed_options->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_t_oop_generator).super_t_generator.out_dir_base_,0,
                 (char *)(this->super_t_oop_generator).super_t_generator.out_dir_base_.
                         _M_string_length,0x39c3d0);
      return;
    }
    iVar1 = std::__cxx11::string::compare((char *)(p_Var2 + 1));
    if (iVar1 != 0) break;
    this->gen_requires_ = false;
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(__return_storage_ptr__,"unknown option lua:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

t_lua_generator(t_program* program,
                  const std::map<std::string, std::string>& parsed_options,
                  const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    gen_requires_ = true;
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("omit_requires") == 0) {
        gen_requires_ = false;
      } else {
        throw "unknown option lua:" + iter->first;
      }
    }

    out_dir_base_ = "gen-lua";
  }